

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::GreaterThanLayerParams::~GreaterThanLayerParams(GreaterThanLayerParams *this)

{
  ~GreaterThanLayerParams(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

GreaterThanLayerParams::~GreaterThanLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.GreaterThanLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}